

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O3

psa_status_t
psa_key_derivation_output_bytes
          (psa_key_derivation_operation_t *operation,uint8_t *output,size_t output_length)

{
  psa_hmac_internal_data *ppVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint8_t *puVar4;
  uint8_t uVar5;
  psa_algorithm_t pVar6;
  byte bVar7;
  byte bVar8;
  int iVar9;
  psa_status_t pVar10;
  uint uVar11;
  uint uVar12;
  byte bVar13;
  size_t sVar14;
  ulong uVar15;
  char cVar16;
  byte bVar17;
  uint8_t *__dest;
  ulong local_148;
  uint8_t *local_140;
  psa_hash_operation_t local_110;
  
  uVar11 = operation->alg;
  uVar12 = uVar11 & 0x2003ffff;
  if ((uVar11 & 0x7f000000) != 0x30000000) {
    uVar12 = uVar11;
  }
  pVar10 = -0x89;
  if (uVar11 == 0) {
    return -0x89;
  }
  uVar15 = operation->capacity;
  if (uVar15 < output_length) {
    operation->capacity = 0;
    pVar10 = -0x8f;
  }
  else {
    if (uVar15 == 0 && output_length == 0) {
      return -0x8f;
    }
    operation->capacity = uVar15 - output_length;
    uVar11 = uVar12 & 0xffffff00;
    if ((uVar11 == 0x20000300) || (uVar11 == 0x20000200)) {
      uVar12 = uVar12 & 0xff;
      uVar11 = uVar12 - 1;
      bVar7 = (byte)uVar11;
      if ((bVar7 < 0x12) && ((0x39f9fU >> (uVar11 & 0x1f) & 1) != 0)) {
        cVar16 = (&DAT_0013cd50)[uVar11 & 0xff];
      }
      else {
        cVar16 = (uVar12 == 0x13) << 6;
      }
      if (output_length == 0) {
        return 0;
      }
      bVar13 = (uVar12 == 0x13) << 6;
      ppVar1 = (psa_hmac_internal_data *)(&(operation->ctx).hkdf.hmac.hash_ctx.ctx.dummy + 4);
      puVar2 = (operation->ctx).hkdf.prk + 0x18;
      puVar3 = (operation->ctx).hkdf.output_block + 0x18;
      local_148 = output_length;
      local_140 = output;
      do {
        while( true ) {
          bVar17 = (operation->ctx).dummy;
          if ((ulong)bVar17 == 0) break;
          bVar8 = bVar17;
          if (local_148 < bVar17) {
            bVar8 = (byte)local_148;
          }
          uVar15 = (ulong)bVar8;
          memcpy(local_140,puVar3 + (byte)(cVar16 - bVar17),uVar15);
          (operation->ctx).dummy = (operation->ctx).dummy - bVar8;
          local_140 = local_140 + uVar15;
          local_148 = local_148 - uVar15;
          if (local_148 == 0) {
            return 0;
          }
        }
        bVar17 = bVar13;
        if ((bVar7 < 0x12) && (((0x39f9fU >> (bVar7 & 0x1f) ^ 1) & 1) == 0)) {
          bVar17 = (&DAT_0013cd50)[uVar11 & 0xff];
        }
        memset(&local_110,0,0xe0);
        uVar5 = (operation->ctx).tls12_prf.block_number;
        if (uVar5 == 0xff) {
          pVar10 = -0x97;
          break;
        }
        (operation->ctx).tls12_prf.block_number = uVar5 + '\x01';
        (operation->ctx).dummy = bVar17;
        iVar9 = psa_hash_clone((psa_hash_operation_t *)ppVar1,&local_110);
        if (iVar9 == 0) {
          if ((operation->ctx).tls12_prf.block_number == '\x01') {
            iVar9 = psa_hash_update((psa_hash_operation_t *)ppVar1,(operation->ctx).tls12_prf.label,
                                    (operation->ctx).tls12_prf.label_length);
            if (iVar9 != 0) goto LAB_00113db1;
            iVar9 = psa_hash_update((psa_hash_operation_t *)ppVar1,(operation->ctx).tls12_prf.seed,
                                    (operation->ctx).tls12_prf.seed_length);
          }
          else {
            iVar9 = psa_hash_update((psa_hash_operation_t *)ppVar1,puVar2,(ulong)bVar17);
          }
          if (iVar9 == 0) {
            uVar15 = (ulong)bVar17;
            iVar9 = psa_hmac_finish_internal(ppVar1,puVar2,uVar15);
            if ((((iVar9 == 0) &&
                 (iVar9 = psa_hash_clone(&local_110,(psa_hash_operation_t *)ppVar1), iVar9 == 0)) &&
                (iVar9 = psa_hash_update((psa_hash_operation_t *)ppVar1,puVar2,uVar15), iVar9 == 0))
               && (((iVar9 = psa_hash_update((psa_hash_operation_t *)ppVar1,
                                             (operation->ctx).tls12_prf.label,
                                             (operation->ctx).tls12_prf.label_length), iVar9 == 0 &&
                    (iVar9 = psa_hash_update((psa_hash_operation_t *)ppVar1,
                                             (operation->ctx).tls12_prf.seed,
                                             (operation->ctx).tls12_prf.seed_length), iVar9 == 0))
                   && (iVar9 = psa_hmac_finish_internal(ppVar1,puVar3,uVar15), iVar9 == 0)))) {
              iVar9 = psa_hash_clone(&local_110,(psa_hash_operation_t *)ppVar1);
            }
          }
        }
LAB_00113db1:
        pVar10 = psa_hash_abort(&local_110);
        if (pVar10 == 0) {
          pVar10 = iVar9;
        }
        if (iVar9 != 0) {
          pVar10 = iVar9;
        }
      } while (pVar10 == 0);
    }
    else {
      if (uVar11 != 0x20000100) {
        return -0x89;
      }
      uVar12 = uVar12 & 0xff;
      uVar11 = uVar12 - 1;
      if (((byte)uVar11 < 0x12) && ((0x39f9fU >> (uVar11 & 0x1f) & 1) != 0)) {
        bVar7 = (&DAT_0013cd50)[uVar11 & 0xff];
      }
      else {
        bVar7 = (uVar12 == 0x13) << 6;
      }
      bVar13 = (operation->ctx).tls12_prf.output_block[0x2a];
      if ((~bVar13 & 6) == 0) {
        (operation->ctx).tls12_prf.output_block[0x2a] = bVar13 | 3;
        puVar2 = &(operation->ctx).hkdf.block_number;
        puVar3 = (operation->ctx).hkdf.output_block;
        ppVar1 = &(operation->ctx).hkdf.hmac;
        sVar14 = output_length;
        __dest = output;
        while( true ) {
          if (sVar14 == 0) {
            return 0;
          }
          bVar13 = (operation->ctx).hkdf.offset_in_block;
          bVar8 = bVar7 - bVar13;
          bVar17 = (byte)sVar14;
          if (bVar8 <= sVar14) {
            bVar17 = bVar8;
          }
          uVar15 = (ulong)bVar17;
          memcpy(__dest,puVar3 + bVar13,uVar15);
          puVar4 = &(operation->ctx).hkdf.offset_in_block;
          *puVar4 = *puVar4 + bVar17;
          sVar14 = sVar14 - uVar15;
          if (sVar14 == 0) {
            return 0;
          }
          if (*puVar2 == 0xff) break;
          (operation->ctx).hkdf.block_number = *puVar2 + '\x01';
          (operation->ctx).hkdf.offset_in_block = '\0';
          pVar10 = psa_hmac_setup_internal
                             (ppVar1,(operation->ctx).hkdf.prk,(ulong)bVar7,uVar12 | 0x1000000);
          if (((pVar10 != 0) ||
              (((*puVar2 != '\x01' &&
                (pVar10 = psa_hash_update(&ppVar1->hash_ctx,puVar3,(ulong)bVar7), pVar10 != 0)) ||
               (pVar10 = psa_hash_update(&ppVar1->hash_ctx,(operation->ctx).hkdf.info,
                                         (operation->ctx).hkdf.info_length), pVar10 != 0)))) ||
             (pVar10 = psa_hash_update(&ppVar1->hash_ctx,puVar2,1), pVar10 != 0)) goto LAB_00113c2b;
          __dest = __dest + uVar15;
          pVar10 = psa_hmac_finish_internal(ppVar1,puVar3,0x40);
          if (pVar10 != 0) goto LAB_00113c2b;
        }
        pVar10 = -0x89;
      }
    }
  }
LAB_00113c2b:
  pVar6 = operation->alg;
  psa_key_derivation_abort(operation);
  operation->alg = pVar6;
  memset(output,0x21,output_length);
  return pVar10;
}

Assistant:

psa_status_t psa_key_derivation_output_bytes(
    psa_key_derivation_operation_t *operation,
    uint8_t *output,
    size_t output_length )
{
    psa_status_t status;
    psa_algorithm_t kdf_alg = psa_key_derivation_get_kdf_alg( operation );

    if( operation->alg == 0 )
    {
        /* This is a blank operation. */
        return PSA_ERROR_BAD_STATE;
    }

    if( output_length > operation->capacity )
    {
        operation->capacity = 0;
        /* Go through the error path to wipe all confidential data now
         * that the operation object is useless. */
        status = PSA_ERROR_INSUFFICIENT_DATA;
        goto exit;
    }
    if( output_length == 0 && operation->capacity == 0 )
    {
        /* Edge case: this is a finished operation, and 0 bytes
         * were requested. The right error in this case could
         * be either INSUFFICIENT_CAPACITY or BAD_STATE. Return
         * INSUFFICIENT_CAPACITY, which is right for a finished
         * operation, for consistency with the case when
         * output_length > 0. */
        return( PSA_ERROR_INSUFFICIENT_DATA );
    }
    operation->capacity -= output_length;

#if defined(MBEDTLS_MD_C)
    if( PSA_ALG_IS_HKDF( kdf_alg ) )
    {
        psa_algorithm_t hash_alg = PSA_ALG_HKDF_GET_HASH( kdf_alg );
        status = psa_key_derivation_hkdf_read( &operation->ctx.hkdf, hash_alg,
                                          output, output_length );
    }
    else
    if( PSA_ALG_IS_TLS12_PRF( kdf_alg ) ||
             PSA_ALG_IS_TLS12_PSK_TO_MS( kdf_alg ) )
    {
        status = psa_key_derivation_tls12_prf_read( &operation->ctx.tls12_prf,
                                               kdf_alg, output,
                                               output_length );
    }
    else
#endif /* MBEDTLS_MD_C */
    {
        return( PSA_ERROR_BAD_STATE );
    }

exit:
    if( status != PSA_SUCCESS )
    {
        /* Preserve the algorithm upon errors, but clear all sensitive state.
         * This allows us to differentiate between exhausted operations and
         * blank operations, so we can return PSA_ERROR_BAD_STATE on blank
         * operations. */
        psa_algorithm_t alg = operation->alg;
        psa_key_derivation_abort( operation );
        operation->alg = alg;
        memset( output, '!', output_length );
    }
    return( status );
}